

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerImpl::EnergyScan
          (CommissionerImpl *this,ErrorHandler *aHandler,uint32_t aChannelMask,uint8_t aCount,
          uint16_t aPeriod,uint16_t aScanDuration,string *aDstAddr)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Error *pEVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar5;
  basic_string_view<char> bVar6;
  string_view fmt;
  format_args args;
  bool local_552;
  Error local_4f8;
  ErrorCode local_4cc;
  ResponseHandler local_4c8;
  ErrorCode local_4a4;
  Error local_4a0;
  ErrorCode local_474;
  Tlv local_470;
  Error local_450;
  ErrorCode local_424;
  Tlv local_420;
  Error local_400;
  ErrorCode local_3d4;
  Tlv local_3d0;
  Error local_3b0;
  ErrorCode local_384;
  Tlv local_380;
  Error local_360;
  ErrorCode local_334;
  Error local_330;
  ErrorCode local_304;
  Tlv local_300;
  Error local_2e0;
  ErrorCode local_2b8;
  allocator local_2b1;
  string local_2b0;
  Error local_290;
  anon_class_1_0_00000001 local_262;
  v10 local_261;
  v10 *local_260;
  size_t local_258;
  string local_250;
  Error local_230;
  ErrorCode local_204;
  Error local_200;
  undefined1 local_1d8 [8];
  anon_class_32_1_d0c21527 onResponse;
  undefined1 local_1a8 [8];
  Request request;
  ByteArray channelMask;
  Address dstAddr;
  Error error;
  uint16_t aScanDuration_local;
  uint16_t aPeriod_local;
  uint8_t aCount_local;
  uint32_t aChannelMask_local;
  ErrorHandler *aHandler_local;
  CommissionerImpl *this_local;
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  CommissionerImpl **local_38;
  undefined1 *local_30;
  CommissionerImpl **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  CommissionerImpl **local_10;
  
  aVar5 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
           )aDstAddr;
  Error::Error((Error *)&dstAddr.mBytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  Address::Address((Address *)
                   &channelMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&request.mEndpoint);
  coap::Message::Message((Message *)local_1a8,kConfirmable,kPost);
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)local_1d8,aHandler);
  Address::Set(&local_200,
               (Address *)
               &channelMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,aDstAddr);
  pEVar4 = Error::operator=((Error *)&dstAddr.mBytes.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_200)
  ;
  local_204 = kNone;
  bVar1 = commissioner::operator!=(pEVar4,&local_204);
  Error::~Error(&local_200);
  if (!bVar1) {
    bVar1 = Address::IsMulticast
                      ((Address *)
                       &channelMask.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      coap::Message::SetType((Message *)local_1a8,kNonConfirmable);
    }
    uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[9])();
    if ((uVar2 & 1) == 0) {
      EnergyScan::anon_class_1_0_00000001::operator()(&local_262);
      local_58 = &local_260;
      local_60 = &local_261;
      bVar6 = ::fmt::v10::operator()(local_60);
      local_258 = bVar6.size_;
      local_260 = (v10 *)bVar6.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_68 = &local_250;
      local_78 = local_260;
      sStack_70 = local_258;
      local_50 = &local_78;
      local_88 = local_260;
      local_80 = local_258;
      local_48 = local_88;
      sStack_40 = local_80;
      this_local = (CommissionerImpl *)
                   ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_30 = local_98;
      local_38 = &this_local;
      local_20 = 0;
      fmt.size_ = 0;
      fmt.data_ = (char *)local_80;
      args.field_1.values_ = aVar5.values_;
      args.desc_ = (unsigned_long_long)local_38;
      local_28 = local_38;
      local_18 = local_30;
      local_10 = local_38;
      ::fmt::v10::vformat_abi_cxx11_(&local_250,local_88,fmt,args);
      Error::Error(&local_230,kInvalidState,&local_250);
      Error::operator=((Error *)&dstAddr.mBytes.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,&local_230);
      Error::~Error(&local_230);
      std::__cxx11::string::~string((string *)&local_250);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2b0,"/c/es",&local_2b1);
      coap::Message::SetUriPath(&local_290,(Message *)local_1a8,&local_2b0);
      pEVar4 = Error::operator=((Error *)&dstAddr.mBytes.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                &local_290);
      local_2b8 = kNone;
      bVar1 = commissioner::operator!=(pEVar4,&local_2b8);
      Error::~Error(&local_290);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
      if (!bVar1) {
        iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[7])();
        tlv::Tlv::Tlv(&local_300,kCommissionerSessionId,(uint16_t)iVar3,kMeshCoP);
        AppendTlv(&local_2e0,(Message *)local_1a8,&local_300);
        pEVar4 = Error::operator=((Error *)&dstAddr.mBytes.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                  &local_2e0);
        local_304 = kNone;
        bVar1 = commissioner::operator!=(pEVar4,&local_304);
        Error::~Error(&local_2e0);
        tlv::Tlv::~Tlv(&local_300);
        if (!bVar1) {
          MakeChannelMask(&local_330,(ByteArray *)&request.mEndpoint,aChannelMask);
          pEVar4 = Error::operator=((Error *)&dstAddr.mBytes.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    &local_330);
          local_334 = kNone;
          bVar1 = commissioner::operator!=(pEVar4,&local_334);
          Error::~Error(&local_330);
          if (!bVar1) {
            tlv::Tlv::Tlv(&local_380,kChannelMask,(ByteArray *)&request.mEndpoint,kMeshCoP);
            AppendTlv(&local_360,(Message *)local_1a8,&local_380);
            pEVar4 = Error::operator=((Error *)&dstAddr.mBytes.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      &local_360);
            local_384 = kNone;
            bVar1 = commissioner::operator!=(pEVar4,&local_384);
            Error::~Error(&local_360);
            tlv::Tlv::~Tlv(&local_380);
            if (!bVar1) {
              tlv::Tlv::Tlv(&local_3d0,kCount,aCount,kMeshCoP);
              AppendTlv(&local_3b0,(Message *)local_1a8,&local_3d0);
              pEVar4 = Error::operator=((Error *)&dstAddr.mBytes.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                        ,&local_3b0);
              local_3d4 = kNone;
              bVar1 = commissioner::operator!=(pEVar4,&local_3d4);
              Error::~Error(&local_3b0);
              tlv::Tlv::~Tlv(&local_3d0);
              if (!bVar1) {
                tlv::Tlv::Tlv(&local_420,kPeriod,aPeriod,kMeshCoP);
                AppendTlv(&local_400,(Message *)local_1a8,&local_420);
                pEVar4 = Error::operator=((Error *)&dstAddr.mBytes.
                                                                                                        
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          ,&local_400);
                local_424 = kNone;
                bVar1 = commissioner::operator!=(pEVar4,&local_424);
                Error::~Error(&local_400);
                tlv::Tlv::~Tlv(&local_420);
                if (!bVar1) {
                  tlv::Tlv::Tlv(&local_470,kScanDuration,aScanDuration,kMeshCoP);
                  AppendTlv(&local_450,(Message *)local_1a8,&local_470);
                  pEVar4 = Error::operator=((Error *)&dstAddr.mBytes.
                                                                                                            
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            ,&local_450);
                  local_474 = kNone;
                  bVar1 = commissioner::operator!=(pEVar4,&local_474);
                  Error::~Error(&local_450);
                  tlv::Tlv::~Tlv(&local_470);
                  if (!bVar1) {
                    uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])();
                    if ((uVar2 & 1) != 0) {
                      SignRequest(&local_4a0,this,(Request *)local_1a8,kMeshCoP,true);
                      pEVar4 = Error::operator=((Error *)&dstAddr.mBytes.
                                                                                                                    
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                ,&local_4a0);
                      local_4a4 = kNone;
                      bVar1 = commissioner::operator!=(pEVar4,&local_4a4);
                      Error::~Error(&local_4a0);
                      if (bVar1) goto LAB_0027a9db;
                    }
                    std::
                    function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>::
                    function<ot::commissioner::CommissionerImpl::EnergyScan(std::function<void(ot::commissioner::Error)>,unsigned_int,unsigned_char,unsigned_short,unsigned_short,std::__cxx11::string_const&)::__0&,void>
                              ((function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>
                                *)&local_4c8,(anon_class_32_1_d0c21527 *)local_1d8);
                    ProxyClient::SendRequest
                              (&this->mProxyClient,(Request *)local_1a8,&local_4c8,
                               (Address *)
                               &channelMask.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage,0xf0bf);
                    std::
                    function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>
                    ::~function(&local_4c8);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_0027a9db:
  local_4cc = kNone;
  bVar1 = commissioner::operator!=
                    ((Error *)&dstAddr.mBytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,&local_4cc);
  local_552 = true;
  if (!bVar1) {
    local_552 = coap::Message::IsNonConfirmable((Message *)local_1a8);
  }
  if (local_552 != false) {
    Error::Error(&local_4f8,
                 (Error *)&dstAddr.mBytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
    std::function<void_(ot::commissioner::Error)>::operator()(aHandler,&local_4f8);
    Error::~Error(&local_4f8);
  }
  EnergyScan(std::function<void(ot::commissioner::Error)>,unsigned_int,unsigned_char,unsigned_short,unsigned_short,std::__cxx11::string_const&)
  ::$_0::~__0((__0 *)local_1d8);
  coap::Message::~Message((Message *)local_1a8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&request.mEndpoint);
  Address::~Address((Address *)
                    &channelMask.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage);
  Error::~Error((Error *)&dstAddr.mBytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void CommissionerImpl::EnergyScan(ErrorHandler       aHandler,
                                  uint32_t           aChannelMask,
                                  uint8_t            aCount,
                                  uint16_t           aPeriod,
                                  uint16_t           aScanDuration,
                                  const std::string &aDstAddr)
{
    Error         error;
    Address       dstAddr;
    ByteArray     channelMask;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        Error error;

        SuccessOrExit(error = aError);
        SuccessOrExit(error = CheckCoapResponseCode(*aResponse));

    exit:
        aHandler(error);
    };

    SuccessOrExit(error = dstAddr.Set(aDstAddr));

    if (dstAddr.IsMulticast())
    {
        request.SetType(coap::Type::kNonConfirmable);
    }

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));
    SuccessOrExit(error = request.SetUriPath(uri::kMgmtEdScan));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kCommissionerSessionId, GetSessionId()}));
    SuccessOrExit(error = MakeChannelMask(channelMask, aChannelMask));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kChannelMask, channelMask}));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kCount, aCount}));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kPeriod, aPeriod}));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kScanDuration, aScanDuration}));

#if OT_COMM_CONFIG_CCM_ENABLE
    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }
#endif

    mProxyClient.SendRequest(request, onResponse, dstAddr, kDefaultMmPort);

exit:
    if (error != ErrorCode::kNone || request.IsNonConfirmable())
    {
        aHandler(error);
    }
}